

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

char * __thiscall tinyxml2::StrPair::GetStr(StrPair *this)

{
  char cVar1;
  uint uVar2;
  StrPair *pSVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  size_t __n;
  char *p;
  char *__s1;
  char *pcVar9;
  bool bVar10;
  int len;
  char buf [10];
  int local_54;
  char local_50 [16];
  char *local_40;
  StrPair *local_38;
  
  if ((this->_flags & 0x100) != 0) {
    *this->_end = '\0';
    uVar2 = this->_flags;
    this->_flags = uVar2 ^ 0x100;
    uVar4 = 0;
    if (uVar2 != 0x100) {
      p = this->_start;
      pcVar9 = p;
      pSVar3 = this;
      if (p < this->_end) {
        do {
          local_38 = pSVar3;
          cVar1 = *p;
          if ((this->_flags & 2U) == 0) {
LAB_00142e43:
            if (((this->_flags & 1U) == 0) || (cVar1 != '&')) {
              *pcVar9 = cVar1;
              __s1 = p + 1;
              goto LAB_00142ec9;
            }
            __s1 = p + 1;
            if (p[1] == '#') {
              local_50[8] = '\0';
              local_50[9] = '\0';
              local_50[0] = '\0';
              local_50[1] = '\0';
              local_50[2] = '\0';
              local_50[3] = '\0';
              local_50[4] = '\0';
              local_50[5] = '\0';
              local_50[6] = '\0';
              local_50[7] = '\0';
              local_54 = 0;
              pcVar6 = XMLUtil::GetCharacterRef(p,local_50,&local_54);
              if (pcVar6 == (char *)0x0) {
                *pcVar9 = *p;
                lVar7 = 1;
              }
              else {
                memcpy(pcVar9,local_50,(long)local_54);
                lVar7 = (long)local_54;
                __s1 = pcVar6;
              }
              pcVar9 = pcVar9 + lVar7;
            }
            else {
              uVar8 = 0;
              pcVar6 = "\"";
              bVar10 = false;
              local_40 = pcVar9;
              do {
                __n = (size_t)*(int *)(pcVar6 + -4);
                iVar5 = strncmp(__s1,*(char **)(pcVar6 + -0xc),__n);
                if ((iVar5 == 0) && (__s1[__n] == ';')) {
                  *local_40 = *pcVar6;
                  pcVar9 = local_40 + 1;
                  p = p + __n + 2;
                  uVar8 = (ulong)bVar10;
                  goto LAB_00142f5e;
                }
                bVar10 = 3 < uVar8;
                uVar8 = uVar8 + 1;
                pcVar6 = pcVar6 + 0x10;
              } while (uVar8 != 5);
              uVar8 = 1;
              pcVar9 = local_40;
LAB_00142f5e:
              pcVar9 = pcVar9 + uVar8;
              __s1 = p + uVar8;
              this = local_38;
            }
          }
          else {
            if (cVar1 == '\n') {
              bVar10 = p[1] == '\r';
            }
            else {
              if (cVar1 != '\r') goto LAB_00142e43;
              bVar10 = p[1] == '\n';
            }
            __s1 = p + 1;
            if (bVar10) {
              __s1 = p + 2;
            }
            *pcVar9 = '\n';
LAB_00142ec9:
            pcVar9 = pcVar9 + 1;
          }
          p = __s1;
          pSVar3 = local_38;
        } while (__s1 < this->_end);
      }
      *pcVar9 = '\0';
      uVar4 = this->_flags;
      if ((uVar4 & 4) != 0) {
        CollapseWhitespace(this);
        uVar4 = this->_flags;
      }
    }
    this->_flags = uVar4 & 0x200;
  }
  return this->_start;
}

Assistant:

const char* StrPair::GetStr()
{
    TIXMLASSERT(_start);
    TIXMLASSERT(_end);
    if (_flags & NEEDS_FLUSH) {
        *_end = 0;
        _flags ^= NEEDS_FLUSH;

        if (_flags) {
            const char* p = _start; // the read pointer
            char* q = _start; // the write pointer

            while (p < _end) {
                if ((_flags & NEEDS_NEWLINE_NORMALIZATION) && *p == CR) {
                    // CR-LF pair becomes LF
                    // CR alone becomes LF
                    // LF-CR becomes LF
                    if (*(p + 1) == LF) {
                        p += 2;
                    } else {
                        ++p;
                    }
                    *q = LF;
                    ++q;
                } else if ((_flags & NEEDS_NEWLINE_NORMALIZATION) && *p == LF) {
                    if (*(p + 1) == CR) {
                        p += 2;
                    } else {
                        ++p;
                    }
                    *q = LF;
                    ++q;
                } else if ((_flags & NEEDS_ENTITY_PROCESSING) && *p == '&') {
                    // Entities handled by tinyXML2:
                    // - special entities in the entity table [in/out]
                    // - numeric character reference [in]
                    //   &#20013; or &#x4e2d;

                    if (*(p + 1) == '#') {
                        const int buflen = 10;
                        char buf[buflen] = {0};
                        int len = 0;
                        const char* adjusted =
                            const_cast<char*>(XMLUtil::GetCharacterRef(p, buf, &len));
                        if (adjusted == 0) {
                            *q = *p;
                            ++p;
                            ++q;
                        } else {
                            TIXMLASSERT(0 <= len && len <= buflen);
                            TIXMLASSERT(q + len <= adjusted);
                            p = adjusted;
                            memcpy(q, buf, len);
                            q += len;
                        }
                    } else {
                        bool entityFound = false;
                        for (int i = 0; i < NUM_ENTITIES; ++i) {
                            const Entity& entity = entities[i];
                            if (strncmp(p + 1, entity.pattern, entity.length) == 0 &&
                                *(p + entity.length + 1) == ';') {
                                // Found an entity - convert.
                                *q = entity.value;
                                ++q;
                                p += entity.length + 2;
                                entityFound = true;
                                break;
                            }
                        }
                        if (!entityFound) {
                            // fixme: treat as error?
                            ++p;
                            ++q;
                        }
                    }
                } else {
                    *q = *p;
                    ++p;
                    ++q;
                }
            }
            *q = 0;
        }
        // The loop below has plenty going on, and this
        // is a less useful mode. Break it out.
        if (_flags & NEEDS_WHITESPACE_COLLAPSING) {
            CollapseWhitespace();
        }
        _flags = (_flags & NEEDS_DELETE);
    }
    TIXMLASSERT(_start);
    return _start;
}